

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

usize __thiscall
Console::Prompt::Private::readNextUnbufferedEscapedSequence
          (Private *this,char *buffer,char firschar,char laschar)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  usize uVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  char ch;
  byte local_51;
  undefined4 local_50;
  undefined4 local_4c;
  char *local_48;
  usize local_40;
  Private *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000009,laschar);
  local_50 = (undefined4)CONCAT71(in_register_00000011,firschar);
  local_48 = buffer + 1;
  local_38 = this;
  do {
    while( true ) {
      sVar4 = read(0,&local_51,1);
      if (sVar4 != 1) {
        iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]dehprox/3rdparty/libnstd/src/Console.cpp"
                              ,0x40a,"read(STDIN_FILENO, &ch, 1) == 1");
        if (iVar3 != 0) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      if (local_51 == '\x1b') break;
      Buffer::append(&this->bufferedInput,&local_51,1);
    }
    *buffer = '\x1b';
    buffer[1] = '\0';
    uVar5 = readUnbufferedEscapedSequence(local_38,buffer,local_48);
    if ((buffer[uVar5] == (char)local_4c) && (*local_48 == (char)local_50)) {
      bVar2 = false;
      local_40 = uVar5 + 1;
    }
    else {
      Buffer::append(&this->bufferedInput,(byte *)buffer,uVar5 + 1);
      bVar2 = true;
    }
  } while (bVar2);
  return local_40;
}

Assistant:

usize readNextUnbufferedEscapedSequence(char* buffer, char firschar, char laschar)
  {
    for(char ch;;)
    {
      VERIFY(read(STDIN_FILENO, &ch, 1) == 1);
      if(ch == '\x1b')
      {
        *buffer = ch;
        buffer[1] = 0;
        usize len = 1 + readUnbufferedEscapedSequence(buffer, buffer + 1);
        char sequenceType = buffer[len - 1];
        if(sequenceType != laschar || buffer[1] != firschar)
        {
          bufferedInput.append((byte*)buffer, len);
          continue;
        }
        return len;
      }
      else
        bufferedInput.append((byte*)&ch, 1);
    }
  }